

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlabKosorajo.c
# Opt level: O1

int checkerBig1(void)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  FILE *__stream;
  char *__s;
  int i;
  uint uVar3;
  int job;
  int check_cnt;
  undefined8 local_38;
  
  local_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar3 = 0xffffffff;
  }
  else {
    ScanInt((FILE *)__stream,(int *)((long)&local_38 + 4));
    if (local_38._4_4_ == 2000) {
      uVar3 = 2000;
      do {
        __s = ScanInt((FILE *)__stream,(int *)&local_38);
        if (__s == "FAILED") {
LAB_0010297a:
          bVar1 = false;
          __s = "FAILED";
        }
        else {
          if (uVar3 != (uint)local_38) {
            printf("wrong output -- ");
            goto LAB_0010297a;
          }
          bVar1 = true;
        }
      } while ((bVar1) && (bVar1 = 1 < uVar3, uVar3 = uVar3 - 1, bVar1));
    }
    else {
      printf("wrong output -- ");
      __s = "FAILED";
    }
    if (__s == "PASSED") {
      iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar2 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
    fclose(__stream);
    puts(__s);
    uVar3 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar3;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");

    const char *fact = Pass;

    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }

    { // test order
        int N = N_MAX, check_cnt;
        fact = ScanInt(out, &check_cnt);

        if (check_cnt != N)
        {
            printf("wrong output -- ");
            fact = Fail;
        }
        else
        {
            for (int i = N; i > 0; i--) {

                int job;
                fact = ScanInt(out, &job);

                if (fact == Fail)
                    break;

                if (job != i) {
                    printf("wrong output -- ");
                    fact = Fail;
                    break;
                }
            }
        }
    }

    if (fact == Pass && HaveGarbageAtTheEnd(out))
        fact = Fail;

    fclose(out);
    
    printf("%s\n", fact);

    testN++;

    return fact == Fail;
}